

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

int Cbs2_ManSolve(Cbs2_Man_t *p,int iLit)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  ulong uVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x570,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x571,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
  }
  if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x572,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
  }
  (p->Pars).nJustThis = 0;
  (p->Pars).nBTThis = 0;
  (p->Pars).nBTThisNc = 0;
  Cbs2_ManAssign(p,iLit,0,0,0);
  iVar7 = Cbs2_ManSolve_rec(p,0);
  iVar11 = 1;
  if (iVar7 == 0) {
    iVar7 = (p->Pars).nBTThis;
    bVar5 = (p->Pars).nJustLimit < (p->Pars).nJustThis;
    p->nFails[0] = p->nFails[0] + (uint)bVar5;
    bVar6 = (p->Pars).nBTLimit < iVar7;
    p->nFails[1] = p->nFails[1] + (uint)bVar6;
    if (!bVar6 && !bVar5) {
      p_00 = p->vModel;
      iVar11 = 0;
      p_00->nSize = 0;
      (p->pProp).iHead = 0;
      iVar7 = (p->pProp).iTail;
      if (0 < iVar7) {
        iVar11 = 0;
        lVar10 = 0;
        do {
          uVar8 = (p->pProp).pData[lVar10];
          if (uVar8 == 0) break;
          if ((int)uVar8 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar8 = uVar8 >> 1;
          if (p->pAig->nObjs <= (int)uVar8) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar3 = *(ulong *)(p->pAig->pObjs + uVar8);
          if ((~(uint)uVar3 & 0x9fffffff) == 0) {
            if ((p->vAssign).nSize <= (int)uVar8) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            Vec_IntPush(p_00,(uint)(uVar3 >> 0x1f) & 0x3ffffffe |
                             (uint)((p->vAssign).pArray[uVar8] == '\0'));
            iVar7 = (p->pProp).iTail;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar7);
      }
    }
  }
  Cbs2_ManCancelUntil(p,0);
  if (0 < (p->vWatchUpds).nSize) {
    piVar4 = (p->vWatchUpds).pArray;
    lVar10 = 0;
    do {
      iVar7 = piVar4[lVar10];
      if (((long)iVar7 < 0) || ((p->vWatches).nSize <= iVar7)) goto LAB_00727193;
      (p->vWatches).pArray[iVar7] = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vWatchUpds).nSize);
  }
  (p->vWatchUpds).nSize = 0;
  if (0 < (p->vActStore).nSize) {
    piVar4 = (p->vActStore).pArray;
    lVar10 = 0;
    do {
      iVar7 = piVar4[lVar10];
      if (((long)iVar7 < 0) || ((p->vActivity).nSize <= iVar7)) {
LAB_00727193:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vActivity).pArray[iVar7] = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vActStore).nSize);
  }
  (p->pJust).iHead = 0;
  (p->pJust).iTail = 0;
  (p->pClauses).iHead = 1;
  (p->pClauses).iTail = 1;
  iVar7 = (p->Pars).nBTThis;
  iVar2 = (p->Pars).nJustThis;
  piVar4 = &(p->Pars).nBTTotal;
  *piVar4 = *piVar4 + iVar7;
  iVar9 = (p->Pars).nJustTotal;
  if (iVar9 <= iVar2) {
    iVar9 = iVar2;
  }
  (p->Pars).nJustTotal = iVar9;
  iVar9 = (p->Pars).nBTLimit;
  if (iVar9 < iVar7) {
    iVar11 = -1;
  }
  iVar1 = (p->Pars).nJustLimit;
  if (iVar1 < iVar2) {
    iVar11 = -1;
  }
  p->nFails[0] = p->nFails[0] + (uint)(iVar1 < iVar2);
  p->nFails[1] = p->nFails[1] + (uint)(iVar9 < iVar7);
  return iVar11;
}

Assistant:

int Cbs2_ManSolve( Cbs2_Man_t * p, int iLit )
{
    int RetValue = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs2_ManAssign( p, iLit, 0, 0, 0 );
    if ( !Cbs2_ManSolve_rec(p, 0) && !Cbs2_ManCheckLimits(p) )
        Cbs2_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Cbs2_ManCancelUntil( p, 0 );
    Cbs2_ManCleanWatch( p );
    Cbs2_ManBumpClean( p );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs2_ManCheckLimits( p ) )
        RetValue = -1;
    return RetValue;
}